

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

bool loadResources(void)

{
  bool bVar1;
  ResourceManager *pRVar2;
  ulong uVar3;
  char *pcVar4;
  BitmapResource *this;
  Resource *res;
  ResourceManager *this_00;
  int i_2;
  int i_1;
  int i;
  ResourceManager *rm;
  undefined8 in_stack_ffffffffffffff28;
  bool load;
  Input *in_stack_ffffffffffffff30;
  ResourceManager *in_stack_ffffffffffffff38;
  ResourceManager *in_stack_ffffffffffffff58;
  FontResource *in_stack_ffffffffffffff60;
  int local_28;
  int local_24;
  int local_20;
  ResourceManager *pRVar5;
  bool local_1;
  
  pRVar2 = ResourceManager::getInstance();
  operator_new(0x18);
  DisplayResource::DisplayResource((DisplayResource *)in_stack_ffffffffffffff30);
  load = SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0);
  bVar1 = ResourceManager::add
                    (in_stack_ffffffffffffff38,&in_stack_ffffffffffffff30->super_Resource,load);
  if (bVar1) {
    uVar3 = al_install_audio();
    if ((uVar3 & 1) == 0) {
      printf("Failed to install audio.\n");
    }
    else {
      al_reserve_samples(0x10);
    }
    operator_new(0x88);
    Player::Player((Player *)in_stack_ffffffffffffff30);
    bVar1 = ResourceManager::add
                      (in_stack_ffffffffffffff38,&in_stack_ffffffffffffff30->super_Resource,load);
    if (bVar1) {
      operator_new(0x188);
      Input::Input(in_stack_ffffffffffffff30);
      bVar1 = ResourceManager::add
                        (in_stack_ffffffffffffff38,&in_stack_ffffffffffffff30->super_Resource,load);
      if (bVar1) {
        operator_new(0x30);
        getResource("gfx/large_font.png");
        FontResource::FontResource(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
        bVar1 = ResourceManager::add
                          (in_stack_ffffffffffffff38,&in_stack_ffffffffffffff30->super_Resource,load
                          );
        if (bVar1) {
          pcVar4 = (char *)operator_new(0x30);
          this = (BitmapResource *)getResource("gfx/small_font.png");
          FontResource::FontResource(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
          bVar1 = ResourceManager::add
                            (in_stack_ffffffffffffff38,&in_stack_ffffffffffffff30->super_Resource,
                             load);
          if (bVar1) {
            for (local_20 = 0; BMP_NAMES[local_20] != (char *)0x0; local_20 = local_20 + 1) {
              pRVar5 = pRVar2;
              in_stack_ffffffffffffff60 = (FontResource *)operator_new(0x30);
              getResource(BMP_NAMES[local_20]);
              BitmapResource::BitmapResource(this,pcVar4);
              bVar1 = ResourceManager::add
                                (in_stack_ffffffffffffff38,
                                 &in_stack_ffffffffffffff30->super_Resource,load);
              if (!bVar1) {
                pcVar4 = getResource(BMP_NAMES[local_20]);
                printf("Failed to load %s\n",pcVar4);
                return false;
              }
              in_stack_ffffffffffffff58 = pRVar2;
              pRVar2 = pRVar5;
            }
            for (local_24 = 0; SAMPLE_NAMES[local_24] != (char *)0x0; local_24 = local_24 + 1) {
              operator_new(0x30);
              getResource(SAMPLE_NAMES[local_24]);
              SampleResource::SampleResource
                        ((SampleResource *)in_stack_ffffffffffffff60,
                         (char *)in_stack_ffffffffffffff58);
              ResourceManager::add
                        (in_stack_ffffffffffffff38,&in_stack_ffffffffffffff30->super_Resource,load);
            }
            for (local_28 = 0; STREAM_NAMES[local_28] != (char *)0x0; local_28 = local_28 + 1) {
              pRVar5 = pRVar2;
              res = (Resource *)operator_new(0x30);
              this_00 = (ResourceManager *)getResource(STREAM_NAMES[local_28]);
              StreamResource::StreamResource
                        ((StreamResource *)in_stack_ffffffffffffff60,
                         (char *)in_stack_ffffffffffffff58);
              ResourceManager::add(this_00,res,SUB81((ulong)pRVar2 >> 0x38,0));
              pRVar2 = pRVar5;
            }
            joypad_start();
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        printf("Failed initializing input.\n");
        local_1 = false;
      }
    }
    else {
      printf("Failed to create player.\n");
      local_1 = false;
    }
  }
  else {
    printf("Failed to create display.\n");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool loadResources(void)
{
   ResourceManager& rm = ResourceManager::getInstance();
   if (!rm.add(new DisplayResource())) {
      printf("Failed to create display.\n");
      return false;
   }

   /* For some reason dsound needs a window... */
   if (!al_install_audio()) {
      printf("Failed to install audio.\n");
      /* Continue anyway. */
   }
   else {
      al_reserve_samples(16);
   }

   if (!rm.add(new Player(), false)) {
      printf("Failed to create player.\n");
      return false;
   }
   if (!rm.add(new Input())) {
      printf("Failed initializing input.\n");
      return false;
   }

   // Load fonts
   if (!rm.add(new FontResource(getResource("gfx/large_font.png"))))
      return false;
   if (!rm.add(new FontResource(getResource("gfx/small_font.png"))))
      return false;

   for (int i = 0; BMP_NAMES[i]; i++) {
      if (!rm.add(new BitmapResource(getResource(BMP_NAMES[i])))) {
         printf("Failed to load %s\n", getResource(BMP_NAMES[i]));
         return false;
      }
   }

   for (int i = 0; SAMPLE_NAMES[i]; i++) {
      if (!rm.add(new SampleResource(getResource(SAMPLE_NAMES[i])))) {
         /* Continue anyway. */
      }
   }

   for (int i = 0; STREAM_NAMES[i]; i++) {
      if (!rm.add(new StreamResource(getResource(STREAM_NAMES[i])))) {
         /* Continue anyway. */
      }
   }

   joypad_start();

   return true;
}